

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupAppendNew(Gia_Man_t *pOne,Gia_Man_t *pTwo)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Man_t *p;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  int local_2c;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Gia_Man_t *pTwo_local;
  Gia_Man_t *pOne_local;
  
  iVar1 = Gia_ManObjNum(pOne);
  iVar2 = Gia_ManObjNum(pTwo);
  p = Gia_ManStart(iVar1 + iVar2);
  pcVar4 = Abc_UtilStrsav(pOne->pName);
  p->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(pOne->pSpec);
  p->pSpec = pcVar4;
  Gia_ManHashAlloc(p);
  pGVar5 = Gia_ManConst0(pOne);
  pGVar5->Value = 0;
  local_2c = 1;
  while( true ) {
    bVar6 = false;
    if (local_2c < pOne->nObjs) {
      pGStack_28 = Gia_ManObj(pOne,local_2c);
      bVar6 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjIsAnd(pGStack_28);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCi(pGStack_28);
      if (iVar1 != 0) {
        uVar3 = Gia_ManAppendCi(p);
        pGStack_28->Value = uVar3;
      }
    }
    else {
      iVar1 = Gia_ObjFanin0Copy(pGStack_28);
      iVar2 = Gia_ObjFanin1Copy(pGStack_28);
      uVar3 = Gia_ManHashAnd(p,iVar1,iVar2);
      pGStack_28->Value = uVar3;
    }
    local_2c = local_2c + 1;
  }
  pGVar5 = Gia_ManConst0(pTwo);
  pGVar5->Value = 0;
  local_2c = 1;
  while( true ) {
    bVar6 = false;
    if (local_2c < pTwo->nObjs) {
      pGStack_28 = Gia_ManObj(pTwo,local_2c);
      bVar6 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjIsAnd(pGStack_28);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsPi(pTwo,pGStack_28);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsCi(pGStack_28);
        if (iVar1 != 0) {
          uVar3 = Gia_ManAppendCi(p);
          pGStack_28->Value = uVar3;
        }
      }
      else {
        iVar1 = Gia_ObjCioId(pGStack_28);
        pGVar5 = Gia_ManPi(pOne,iVar1);
        pGStack_28->Value = pGVar5->Value;
      }
    }
    else {
      iVar1 = Gia_ObjFanin0Copy(pGStack_28);
      iVar2 = Gia_ObjFanin1Copy(pGStack_28);
      uVar3 = Gia_ManHashAnd(p,iVar1,iVar2);
      pGStack_28->Value = uVar3;
    }
    local_2c = local_2c + 1;
  }
  Gia_ManHashStop(p);
  local_2c = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(pOne);
    bVar6 = false;
    if (local_2c < iVar1) {
      pGStack_28 = Gia_ManCo(pOne,local_2c);
      bVar6 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjFanin0Copy(pGStack_28);
    uVar3 = Gia_ManAppendCo(p,iVar1);
    pGStack_28->Value = uVar3;
    local_2c = local_2c + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(pTwo);
    bVar6 = false;
    if (local_2c < iVar1) {
      pGStack_28 = Gia_ManCo(pTwo,local_2c);
      bVar6 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjFanin0Copy(pGStack_28);
    uVar3 = Gia_ManAppendCo(p,iVar1);
    pGStack_28->Value = uVar3;
    local_2c = local_2c + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(pOne);
    bVar6 = false;
    if (local_2c < iVar1) {
      iVar1 = Gia_ManPoNum(pOne);
      pGStack_28 = Gia_ManCo(pOne,iVar1 + local_2c);
      bVar6 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjFanin0Copy(pGStack_28);
    uVar3 = Gia_ManAppendCo(p,iVar1);
    pGStack_28->Value = uVar3;
    local_2c = local_2c + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(pTwo);
    bVar6 = false;
    if (local_2c < iVar1) {
      iVar1 = Gia_ManPoNum(pTwo);
      pGStack_28 = Gia_ManCo(pTwo,iVar1 + local_2c);
      bVar6 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjFanin0Copy(pGStack_28);
    uVar3 = Gia_ManAppendCo(p,iVar1);
    pGStack_28->Value = uVar3;
    local_2c = local_2c + 1;
  }
  iVar1 = Gia_ManRegNum(pOne);
  iVar2 = Gia_ManRegNum(pTwo);
  Gia_ManSetRegNum(p,iVar1 + iVar2);
  return p;
}

Assistant:

Gia_Man_t * Gia_ManDupAppendNew( Gia_Man_t * pOne, Gia_Man_t * pTwo )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(pOne) + Gia_ManObjNum(pTwo) );
    pNew->pName = Abc_UtilStrsav( pOne->pName );
    pNew->pSpec = Abc_UtilStrsav( pOne->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(pOne)->Value = 0;
    Gia_ManForEachObj1( pOne, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    Gia_ManConst0(pTwo)->Value = 0;
    Gia_ManForEachObj1( pTwo, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsPi(pTwo, pObj) )
            pObj->Value = Gia_ManPi(pOne, Gia_ObjCioId(pObj))->Value;
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    Gia_ManHashStop( pNew );
    // primary outputs
    Gia_ManForEachPo( pOne, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachPo( pTwo, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // flop inputs
    Gia_ManForEachRi( pOne, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachRi( pTwo, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(pOne) + Gia_ManRegNum(pTwo) );
    return pNew;
}